

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void myarimatest(void)

{
  int N_00;
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  FILE *__stream;
  double *x;
  void *__ptr_01;
  void *__ptr_02;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  double dStack_c8;
  int rmethod;
  double offset;
  int local_b8;
  int approx;
  int constant;
  int trace;
  char *ic;
  int seasonal [4];
  int local_90 [2];
  int order [3];
  int imean;
  myarima_object obj;
  double *newxreg;
  double *xreg;
  double *amse;
  double *xpred;
  int method;
  int biasadj;
  int drift;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  order[1] = 1;
  local_90[0] = 1;
  local_90[1] = 1;
  order[0] = 1;
  ic._0_4_ = 0;
  ic._4_4_ = 0;
  seasonal[0] = 0;
  seasonal[1] = 0;
  _constant = "aic";
  approx = 0;
  local_b8 = 0;
  offset._4_4_ = 0;
  dStack_c8 = 0.0;
  ifp._4_4_ = 0;
  __ptr = malloc(0);
  __ptr_00 = malloc(0);
  __stream = fopen("../data/seriesB.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp1 + (long)d + 0x4af);
      d = d + 1;
    }
    x = (double *)malloc((long)d << 3);
    __ptr_01 = malloc((long)d << 4);
    __ptr_02 = malloc(0);
    for (d = 0; d < N_00; d = d + 1) {
      x[d] = temp1[(long)d + 0x4af];
    }
    for (d = 0; d < 0; d = d + 1) {
      *(double *)((long)__ptr_02 + (long)d * 8) = temp2[(long)(N_00 + d) + 0x4af];
      *(double *)((long)__ptr_02 + (long)d * 8) = temp2[(long)(N_00 + d) + -1];
    }
    register0x00000000 =
         myarima(x,N_00,local_90,(int *)&ic,local_b8,_constant,approx,offset._4_4_,dStack_c8,
                 (double *)0x0,0,(int *)((long)&ifp + 4));
    myarima_summary(register0x00000000);
    myarima_free(stack0xffffffffffffff80);
    free(x);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void myarimatest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	int drift,biasadj,method;
	double *xpred, *amse,*xreg,*newxreg;
	myarima_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 1;
	d = 1;
	q = 1;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[4] = {P,D,Q,s};
	const char *ic = "aic";
	int trace = 0;
	int constant = 0;
	int approx = 0;
	double offset = 0;
	int rmethod = 0;


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	drift = 1;
	biasadj = 0;
	method = 0;

	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	obj = myarima(inp,N,order,seasonal, constant, ic, trace, approx, offset,NULL, r, &rmethod) ;

	myarima_summary(obj);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	

	myarima_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}